

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::updateArrow(QComboBoxPrivate *this,StateFlag state)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  QRect local_b8;
  QStyleOptionComboBox local_a8;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->arrowState != state) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this->arrowState = state;
    memset(&local_a8,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_a8);
    (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&local_a8);
    local_b8 = QWidget::rect(this_00);
    QWidget::update(this_00,&local_b8);
    QStyleOptionComboBox::~QStyleOptionComboBox(&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateArrow(QStyle::StateFlag state)
{
    Q_Q(QComboBox);
    if (arrowState == state)
        return;
    arrowState = state;
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    q->update(q->rect());
}